

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# defines.cpp
# Opt level: O0

void __thiscall vera::HaveDefines::addDefine(HaveDefines *this,string *_define,vec2 _v)

{
  int in_R8D;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *_define_local;
  HaveDefines *this_local;
  vec2 _v_local;
  
  local_20 = _define;
  _define_local = (string *)this;
  this_local = (HaveDefines *)_v;
  toString_abi_cxx11_(&local_80,(vera *)&this_local,(vec2 *)0x2c,'\x03',in_R8D);
  std::operator+(&local_60,"vec2(",&local_80);
  std::operator+(&local_40,&local_60,")");
  (*this->_vptr_HaveDefines[10])(this,_define,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

void HaveDefines::addDefine( const std::string &_define, glm::vec2 _v ) {
    addDefine(_define, "vec2(" + toString(_v, ',') + ")");
}